

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbFunc.c
# Opt level: O2

Gia_Man_t * Acb_NtkDeriveMiterCnfInter(Gia_Man_t *p,int iTar,int nTars)

{
  int iVar1;
  Gia_Man_t *pGVar2;
  Gia_Man_t *pGVar3;
  int iVar4;
  int iVar5;
  bool bVar6;
  
  pGVar2 = Gia_ManDup(p);
  iVar4 = 0;
  if (0 < iTar) {
    iVar4 = iTar;
  }
  iVar5 = -nTars;
  while( true ) {
    iVar1 = pGVar2->vCis->nSize;
    bVar6 = iVar4 == 0;
    iVar4 = iVar4 + -1;
    if (bVar6) {
      pGVar3 = Gia_ManDupCofactorVar(pGVar2,(iTar - nTars) + iVar1,0);
      Gia_ManStop(pGVar2);
      pGVar2 = Acb_NtkEcoSynthesize(pGVar3);
      Gia_ManStop(pGVar3);
      pGVar3 = Gia_ManDupRemovePis(pGVar2,nTars);
      Gia_ManStop(pGVar2);
      return pGVar3;
    }
    pGVar3 = Gia_ManDupUniv(pGVar2,iVar1 + iVar5);
    if (pGVar3->vCis->nSize != pGVar2->vCis->nSize) break;
    Gia_ManStop(pGVar2);
    pGVar2 = Acb_NtkEcoSynthesize(pGVar3);
    Gia_ManStop(pGVar3);
    iVar5 = iVar5 + 1;
  }
  __assert_fail("Gia_ManCiNum(pCof) == Gia_ManCiNum(p)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/acb/acbFunc.c"
                ,0x9a4,"Gia_Man_t *Acb_NtkDeriveMiterCnfInter(Gia_Man_t *, int, int)");
}

Assistant:

Gia_Man_t * Acb_NtkDeriveMiterCnfInter( Gia_Man_t * p, int iTar, int nTars )
{
    Gia_Man_t * pCof1, * pCof = Gia_ManDup( p ); int v;
    for ( v = 0; v < iTar; v++ )
    {
        pCof = Gia_ManDupUniv( p = pCof, Gia_ManCiNum(pCof) - nTars + v );
        assert( Gia_ManCiNum(pCof) == Gia_ManCiNum(p) );
        Gia_ManStop( p );

        pCof = Acb_NtkEcoSynthesize( p = pCof );
        Gia_ManStop( p );
    }
    pCof1 = Gia_ManDupCofactorVar( pCof, Gia_ManCiNum(pCof) - nTars + iTar, 0 );
    Gia_ManStop( pCof );

    pCof1 = Acb_NtkEcoSynthesize( p = pCof1 );
    Gia_ManStop( p );

    pCof1 = Gia_ManDupRemovePis( p = pCof1, nTars );
    Gia_ManStop( p );
    return pCof1;
}